

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall
CVmImageLoader::read_data(CVmImageLoader *this,char *buf,size_t read_len,ulong *remaining_size)

{
  if (read_len <= *remaining_size) {
    *remaining_size = *remaining_size - read_len;
    (*this->fp_->_vptr_CVmImageFile[3])();
    return;
  }
  err_throw(0x132);
}

Assistant:

void CVmImageLoader::read_data(char *buf, size_t read_len,
                               ulong *remaining_size)
{
    /* ensure we have enough data left in our block */
    if (read_len > *remaining_size)
        err_throw(VMERR_IMAGE_BLOCK_TOO_SMALL);

    /* decrement the remaining size counter for the data we just read */
    *remaining_size -= read_len;

    /* read the data */
    fp_->copy_data(buf, read_len);
}